

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.c
# Opt level: O1

long * permute(long *a,int c,long s)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  long lVar5;
  
  auVar1 = _DAT_001091d0;
  if (a == (long *)0x0) {
    permute::source = permute::source + 1;
  }
  else {
    permute::set = a;
    if (0 < c) {
      lVar5 = (ulong)(uint)c - 1;
      auVar3._8_4_ = (int)lVar5;
      auVar3._0_8_ = lVar5;
      auVar3._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar2 = 0;
      auVar3 = auVar3 ^ _DAT_001091d0;
      auVar4 = _DAT_001091c0;
      do {
        auVar6 = auVar4 ^ auVar1;
        if ((bool)(~(auVar6._4_4_ == auVar3._4_4_ && auVar3._0_4_ < auVar6._0_4_ ||
                    auVar3._4_4_ < auVar6._4_4_) & 1)) {
          a[uVar2] = uVar2;
        }
        if ((auVar6._12_4_ != auVar3._12_4_ || auVar6._8_4_ <= auVar3._8_4_) &&
            auVar6._12_4_ <= auVar3._12_4_) {
          a[uVar2 + 1] = uVar2 + 1;
        }
        uVar2 = uVar2 + 2;
        lVar5 = auVar4._8_8_;
        auVar4._0_8_ = auVar4._0_8_ + 2;
        auVar4._8_8_ = lVar5 + 2;
      } while ((c + 1U & 0xfffffffe) != uVar2);
    }
    if (0 < c) {
      uVar2 = 0;
      do {
        dss_random(&permute::source,0,(long)(c + -1),s);
        lVar5 = a[permute::source];
        a[permute::source] = a[uVar2];
        a[uVar2] = lVar5;
        permute::source = 0;
        uVar2 = uVar2 + 1;
      } while ((uint)c != uVar2);
    }
  }
  if (c <= permute::source) {
    permute::source = permute::source - c;
  }
  return permute::set + permute::source;
}

Assistant:

long *
permute(long *a, int c, long s)
	{
    int i;
    static long source;
    static long *set, temp;
    
	if (a != (long *)NULL)
		{
		set = a;
		for (i=0; i < c; i++)
			*(a + i) = i;
		for (i=0; i < c; i++)
			{
			RANDOM(source, 0L, (long)(c - 1), s);
			temp = *(a + source);
			*(a + source) = *(a + i) ;
			*(a + i) = temp;
			source = 0;
			}
		}
	else
		source += 1;
	
	if (source >= c)
		source -= c;
	
	return(set + source);
	}